

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Vec_Int_t * Gia_ManFindMapping(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar3;
  int i;
  int i_00;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  i_00 = 0;
  iVar1 = -1;
  while( true ) {
    if (vChains->nSize <= i_00) {
      return p_00;
    }
    p_01 = Vec_WecEntry(vChains,i_00);
    iVar2 = p_01->nSize;
    if (iVar2 < 1) break;
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(p_01,iVar3);
      i = iVar1 * 5 + 3;
      iVar2 = Vec_IntEntry(vFadds,i);
      iVar2 = Vec_IntEntry(p_00,iVar2);
      if (iVar2 != -1) {
        __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x268,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar2 = Vec_IntEntry(vFadds,i);
      Vec_IntWriteEntry(p_00,iVar2,i_00);
      iVar2 = p_01->nSize;
    }
    iVar3 = iVar1 * 5 + 4;
    iVar2 = Vec_IntEntry(vFadds,iVar3);
    iVar2 = Vec_IntEntry(p_00,iVar2);
    if (iVar2 != -1) {
      __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x26c,
                    "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    iVar2 = Vec_IntEntry(vFadds,iVar3);
    Vec_IntWriteEntry(p_00,iVar2,i_00);
    i_00 = i_00 + 1;
  }
  __assert_fail("Vec_IntSize(vChain) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                ,0x264,
                "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)")
  ;
}

Assistant:

Vec_Int_t * Gia_ManFindMapping( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd = -1;
    Vec_Int_t * vMap2Chain = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        assert( Vec_IntSize(vChain) > 0 );
        Vec_IntForEachEntry( vChain, iFadd, k )
        {
            //printf( "Chain %d: setting SUM %d (obj %d)\n", i, k, Vec_IntEntry(vFadds, 5*iFadd+3) );
            assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1 );
            Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3), i );
        }
        //printf( "Chain %d: setting CARRY (obj %d)\n", i, Vec_IntEntry(vFadds, 5*iFadd+4) );
        assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1 );
        Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4), i );
    }
    return vMap2Chain;
}